

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Sched.c
# Opt level: O0

void Llb_MtrUseSelectedColumn(Llb_Mtr_t *p,int iCol)

{
  int local_18;
  int iVar;
  int iCol_local;
  Llb_Mtr_t *p_local;
  
  if ((iCol < 1) || (p->nCols + -1 <= iCol)) {
    __assert_fail("iCol >= 1 && iCol < p->nCols - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Sched.c"
                  ,0xa0,"void Llb_MtrUseSelectedColumn(Llb_Mtr_t *, int)");
  }
  local_18 = 0;
  do {
    if (p->nRows <= local_18) {
      return;
    }
    if (p->pMatrix[iCol][local_18] != '\0') {
      if ((p->pProdVars[local_18] == '\x01') && (p->pProdNums[local_18] == 1)) {
        p->pProdVars[local_18] = '\0';
        p->pProdNums[local_18] = 0;
      }
      else {
        if (p->pProdVars[local_18] == '\0') {
          p->pProdVars[local_18] = '\x01';
          p->pProdNums[local_18] = p->pRowSums[local_18];
        }
        p->pProdNums[local_18] = p->pProdNums[local_18] + -1;
        if (p->pProdNums[local_18] < 0) {
          __assert_fail("p->pProdNums[iVar] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Sched.c"
                        ,0xb1,"void Llb_MtrUseSelectedColumn(Llb_Mtr_t *, int)");
        }
        if (p->pProdNums[local_18] < 0) {
          Abc_Print(-1,"Llb_MtrUseSelectedColumn() Internal error!\n");
        }
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void Llb_MtrUseSelectedColumn( Llb_Mtr_t * p, int iCol )
{
    int iVar;
    assert( iCol >= 1 && iCol < p->nCols - 1 );
    for ( iVar = 0; iVar < p->nRows; iVar++ )
    {
        if ( p->pMatrix[iCol][iVar] == 0 )
            continue;
        if ( p->pProdVars[iVar] == 1 && p->pProdNums[iVar] == 1 )
        {
            p->pProdVars[iVar] = 0;
            p->pProdNums[iVar] = 0;
            continue;
        }
        if ( p->pProdVars[iVar] == 0 )
        {
            p->pProdVars[iVar] = 1;
            p->pProdNums[iVar] = p->pRowSums[iVar];
        }
        p->pProdNums[iVar]--;
        assert( p->pProdNums[iVar] >= 0 );
        if ( p->pProdNums[iVar] < 0 )
            Abc_Print( -1, "Llb_MtrUseSelectedColumn() Internal error!\n" );
    }
}